

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

StructSize capnp::anon_unknown_70::structSizeFromSchema(StructSchema schema)

{
  uint16_t uVar1;
  unsigned_short data;
  unsigned_short pointers;
  Reader local_78;
  undefined1 local_48 [8];
  Reader node;
  StructSchema schema_local;
  
  node._reader._40_8_ = schema.super_Schema.raw;
  Schema::getProto(&local_78,(Schema *)&node._reader.nestingLimit);
  capnp::schema::Node::Reader::getStruct((Reader *)local_48,&local_78);
  uVar1 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_48);
  data = bounded<unsigned_short>(uVar1);
  uVar1 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_48);
  pointers = bounded<unsigned_short>(uVar1);
  _::StructSize::StructSize((StructSize *)((long)&schema_local.super_Schema.raw + 4),data,pointers);
  return schema_local.super_Schema.raw._4_4_;
}

Assistant:

inline _::StructSize structSizeFromSchema(StructSchema schema) {
  auto node = schema.getProto().getStruct();
  return _::StructSize(
      bounded(node.getDataWordCount()) * WORDS,
      bounded(node.getPointerCount()) * POINTERS);
}